

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslcertificate.cpp
# Opt level: O0

void __thiscall
QSslCertificate::QSslCertificate(QSslCertificate *this,QIODevice *device,EncodingFormat format)

{
  bool bVar1;
  QSslCertificatePrivate *this_00;
  QTlsBackend *pQVar2;
  QLoggingCategory *cat;
  int in_EDX;
  long in_RSI;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_RDI;
  long in_FS_OFFSET;
  _func_QList<QSslCertificate>_QByteArray_ptr_int *X509Reader;
  QTlsBackend *tlsBackend;
  QList<QSslCertificate> certs;
  QByteArray data;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QSslCertificatePrivate *in_stack_ffffffffffffff58;
  QLoggingCategory *this_01;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  char local_50 [32];
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  ulong local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QSslCertificatePrivate *)operator_new(0x10);
  QSslCertificatePrivate::QSslCertificatePrivate(this_00);
  QExplicitlySharedDataPointer<QSslCertificatePrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QSslCertificatePrivate> *)in_RDI,
             in_stack_ffffffffffffff58);
  if (in_RSI != 0) {
    local_30 = 0xaaaaaaaaaaaaaaaa;
    local_28 = 0xaaaaaaaaaaaaaaaa;
    local_20 = 0xaaaaaaaaaaaaaaaa;
    QIODevice::readAll();
    bVar1 = QByteArray::isEmpty((QByteArray *)0x26c9c9);
    if ((!bVar1) && (pQVar2 = QTlsBackend::activeOrAnyBackend(), pQVar2 != (QTlsBackend *)0x0)) {
      if (in_EDX == 0) {
        cat = (QLoggingCategory *)(**(code **)(*(long *)pQVar2 + 0xe8))();
      }
      else {
        cat = (QLoggingCategory *)(**(code **)(*(long *)pQVar2 + 0xf0))();
      }
      if (cat == (QLoggingCategory *)0x0) {
        local_18 = 0xaaaaaaaaaaaaaaaa;
        local_10 = 0xaaaaaaaaaaaaaaaa;
        this_01 = cat;
        QtPrivateLogging::lcSsl();
        anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::
        QLoggingCategoryMacroHolder(in_RDI,cat);
        while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                                 ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
          anon_unknown.dwarf_4b2591::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                    ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x26ca90);
          QMessageLogger::QMessageLogger
                    ((QMessageLogger *)this_01,(char *)this_00,(int)((ulong)in_RDI >> 0x20),
                     (char *)cat,(char *)0x26caa6);
          QMessageLogger::warning
                    (local_50,"Current TLS plugin does not support reading from PEM/DER");
          local_10 = local_10 & 0xffffffffffffff00;
        }
      }
      else {
        local_68 = 0xaaaaaaaaaaaaaaaa;
        local_60 = 0xaaaaaaaaaaaaaaaa;
        local_58 = 0xaaaaaaaaaaaaaaaa;
        (*(code *)cat)(&local_68,&local_30,1);
        bVar1 = QList<QSslCertificate>::isEmpty((QList<QSslCertificate> *)0x26cb0e);
        if (!bVar1) {
          QList<QSslCertificate>::first((QList<QSslCertificate> *)in_RDI);
          QExplicitlySharedDataPointer<QSslCertificatePrivate>::operator=
                    ((QExplicitlySharedDataPointer<QSslCertificatePrivate> *)in_RDI,
                     (QExplicitlySharedDataPointer<QSslCertificatePrivate> *)cat);
        }
        QList<QSslCertificate>::~QList((QList<QSslCertificate> *)0x26cb33);
      }
    }
    QByteArray::~QByteArray((QByteArray *)0x26cb45);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QSslCertificate::QSslCertificate(QIODevice *device, QSsl::EncodingFormat format)
    : d(new QSslCertificatePrivate)
{
    if (device) {
        const auto data = device->readAll();
        if (data.isEmpty())
            return;

        const auto *tlsBackend = QTlsBackend::activeOrAnyBackend();
        if (!tlsBackend)
            return;

        auto *X509Reader = format == QSsl::Pem ? tlsBackend->X509PemReader() : tlsBackend->X509DerReader();
        if (!X509Reader) {
            qCWarning(lcSsl, "Current TLS plugin does not support reading from PEM/DER");
            return;
        }

        QList<QSslCertificate> certs = X509Reader(data, 1);
        if (!certs.isEmpty())
            d = certs.first().d;
    }
}